

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

double __thiscall HPresolve::getRowDualPost(HPresolve *this,int row,int col)

{
  double dVar1;
  reference pvVar2;
  reference pvVar3;
  int in_ESI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *this_00;
  double dVar4;
  double y;
  int kk;
  double x;
  size_type in_stack_ffffffffffffff98;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa0;
  double in_stack_ffffffffffffffb8;
  HPreData *in_stack_ffffffffffffffc0;
  undefined4 local_1c;
  undefined8 local_18;
  
  local_18 = 0.0;
  pvVar2 = std::vector<int,_std::allocator<int>_>::at
                     ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa0,
                      in_stack_ffffffffffffff98);
  local_1c = *pvVar2;
  while( true ) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa0,
                        in_stack_ffffffffffffff98);
    if (*pvVar2 <= local_1c) break;
    in_stack_ffffffffffffffc0 = (HPreData *)(in_RDI + 0x240);
    std::vector<int,_std::allocator<int>_>::at
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff98);
    pvVar2 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa0,
                        in_stack_ffffffffffffff98);
    if (*pvVar2 != 0) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa0,
                          in_stack_ffffffffffffff98);
      if (*pvVar2 != in_ESI) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        dVar1 = *pvVar3;
        std::vector<int,_std::allocator<int>_>::at
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa0,
                   in_stack_ffffffffffffff98);
        pvVar3 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        in_stack_ffffffffffffffb8 = local_18;
        local_18 = dVar1 * *pvVar3 + local_18;
      }
    }
    local_1c = local_1c + 1;
  }
  pvVar3 = std::vector<double,_std::allocator<double>_>::at
                     (in_stack_ffffffffffffffa0,(size_type)local_18);
  this_00 = (vector<double,_std::allocator<double>_> *)(local_18 + *pvVar3);
  pvVar3 = std::vector<double,_std::allocator<double>_>::at(this_00,(size_type)local_18);
  dVar1 = *pvVar3;
  dVar4 = HPreData::getaij(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20)
                           ,SUB84(in_stack_ffffffffffffffb8,0));
  return -((double)this_00 - dVar1) / dVar4;
}

Assistant:

double HPresolve::getRowDualPost(int row, int col) {
	double x = 0;

	for (int kk=Astart.at(col); kk<Aend.at(col);++kk)
		if (flagRow.at(Aindex.at(kk)) && Aindex.at(kk) != row)
			x = x + Avalue.at(kk)*valueRowDual.at(Aindex.at(kk));

	x = x + colCostAtEl.at(col) - valueColDual.at(col);

	double y=getaij(row,col);
	return -x/y;
}